

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_bindings.cpp
# Opt level: O0

int main(void)

{
  i args;
  element_type *peVar1;
  long lVar2;
  eid *in_RDX;
  anon_class_8_1_3fcf65d9_for_object_ in_stack_ffffffffffffff88;
  undefined8 in_stack_ffffffffffffff90;
  long local_60;
  __shared_ptr<interface,_(__gnu_cxx::_Lock_policy)2> local_50;
  __shared_ptr<interface,_(__gnu_cxx::_Lock_policy)2> local_40;
  i *local_30;
  i *local_20;
  i injector;
  eid id;
  
  injector.super_injector_t._12_4_ = 0;
  injector.super_injector_t._8_4_ = 1;
  local_30 = anon_class_1_0_00000001::operator()
                       ((i *)&dynamic_bindings,
                        (anon_class_1_0_00000001 *)&injector.super_injector_t.field_0x8,in_RDX);
  args.super_injector_t._8_8_ = in_stack_ffffffffffffff90;
  args.super_injector_t.
  super_pool<boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,_interface,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_boost_ext[P]di_example_dynamic_bindings_cpp:28:32),_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>_>_>
  .
  super_dependency<boost::ext::di::v1_3_0::scopes::instance,_interface,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_boost_ext[P]di_example_dynamic_bindings_cpp:28:32),_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>
  .
  super_scope<interface,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_boost_ext[P]di_example_dynamic_bindings_cpp:28:32),_int>
  .object_.id = (dependency<boost::ext::di::v1_3_0::scopes::instance,_interface,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_boost_ext[P]di_example_dynamic_bindings_cpp:28:32),_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>
                 )(dependency<boost::ext::di::v1_3_0::scopes::instance,_interface,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_boost_ext[P]di_example_dynamic_bindings_cpp:28:32),_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>
                   )in_stack_ffffffffffffff88.id;
  local_20 = boost::ext::di::v1_3_0::make_injector<boost::ext::di::v1_3_0::config,_i,_0,_0>
                       ((i *)local_30,args);
  boost::ext::di::v1_3_0::core::
  injector<boost::ext::di::v1_3_0::config,_boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>_>,_i>
  ::create<std::shared_ptr<interface>,_0>
            ((injector<boost::ext::di::v1_3_0::config,_boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>_>,_i>
              *)&local_40);
  peVar1 = std::__shared_ptr<interface,_(__gnu_cxx::_Lock_policy)2>::get(&local_40);
  if (peVar1 == (element_type *)0x0) {
    local_60 = 0;
  }
  else {
    local_60 = __dynamic_cast(peVar1,&interface::typeinfo,&implementation1::typeinfo,0);
  }
  if (local_60 == 0) {
    __assert_fail("dynamic_cast<implementation1*>(injector.create<std::shared_ptr<interface>>().get())"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/boost-ext[P]di/example/dynamic_bindings.cpp"
                  ,0x2f,"int main()");
  }
  std::shared_ptr<interface>::~shared_ptr((shared_ptr<interface> *)&local_40);
  injector.super_injector_t._8_4_ = 2;
  boost::ext::di::v1_3_0::core::
  injector<boost::ext::di::v1_3_0::config,_boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>_>,_i>
  ::create<std::shared_ptr<interface>,_0>
            ((injector<boost::ext::di::v1_3_0::config,_boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>_>,_i>
              *)&local_50);
  peVar1 = std::__shared_ptr<interface,_(__gnu_cxx::_Lock_policy)2>::get(&local_50);
  if (peVar1 == (element_type *)0x0) {
    lVar2 = 0;
  }
  else {
    lVar2 = __dynamic_cast(peVar1,&interface::typeinfo,&implementation2::typeinfo,0);
  }
  if (lVar2 != 0) {
    std::shared_ptr<interface>::~shared_ptr((shared_ptr<interface> *)&local_50);
    return injector.super_injector_t._12_4_;
  }
  __assert_fail("dynamic_cast<implementation2*>(injector.create<std::shared_ptr<interface>>().get())"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/boost-ext[P]di/example/dynamic_bindings.cpp"
                ,0x33,"int main()");
}

Assistant:

int main() {
  auto id = e1;

  /*<<create interface with `id = e1`>>*/
  auto injector = di::make_injector(dynamic_bindings(id));
  assert(dynamic_cast<implementation1*>(injector.create<std::shared_ptr<interface>>().get()));

  id = e2;
  /*<<create interface with `id = e2`>>*/
  assert(dynamic_cast<implementation2*>(injector.create<std::shared_ptr<interface>>().get()));
  (void)id;
}